

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_sse2.c
# Opt level: O3

void aom_highbd_quantize_b_32x32_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  uint *puVar1;
  uint *puVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  bool bVar37;
  bool bVar38;
  int iVar39;
  ulong uVar40;
  short *psVar41;
  long lVar42;
  int *piVar43;
  int *piVar44;
  ushort uVar45;
  uint uVar46;
  ushort uVar49;
  ushort uVar50;
  uint uVar51;
  ushort uVar52;
  ushort uVar53;
  uint uVar54;
  ushort uVar55;
  ushort uVar56;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  uint uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  int iVar80;
  undefined1 auVar78 [16];
  int iVar81;
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  uint uVar90;
  uint uVar98;
  uint uVar99;
  uint uVar100;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  int iVar101;
  int iVar107;
  int iVar108;
  int iVar109;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  uint uVar140;
  uint uVar141;
  undefined1 auVar133 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  uint uVar142;
  uint uVar143;
  uint uVar147;
  uint uVar148;
  uint uVar149;
  undefined1 auVar144 [16];
  uint uVar150;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  uint uVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  int iVar156;
  int iVar159;
  int iVar160;
  int iVar161;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  uint uVar162;
  uint uVar167;
  uint uVar168;
  undefined1 auVar163 [16];
  uint uVar169;
  uint uVar170;
  undefined1 auVar166 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  __m128i sign_lo;
  undefined1 local_178 [16];
  int local_168;
  int aiStack_164 [5];
  undefined8 local_150;
  int thresh [4];
  __m128i sign_hi_4;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  
  auVar60 = psraw(ZEXT416(*(uint *)zbin_ptr),1);
  auVar47 = ZEXT416(*(uint *)zbin_ptr) & _DAT_0050d550;
  auVar79._0_2_ = auVar47._0_2_ + auVar60._0_2_;
  auVar79._2_2_ = auVar47._2_2_ + auVar60._2_2_;
  auVar79._4_2_ = auVar60._4_2_;
  auVar79._6_2_ = auVar60._6_2_;
  auVar79._8_2_ = auVar47._8_2_ + auVar60._8_2_;
  auVar79._10_2_ = auVar47._10_2_ + auVar60._10_2_;
  auVar79._12_2_ = auVar47._12_2_ + auVar60._12_2_;
  auVar79._14_2_ = auVar47._14_2_ + auVar60._14_2_;
  auVar47 = pshuflw(auVar79,auVar79,0x60);
  local_150 = CONCAT44(auVar47._4_4_ >> 0x10,auVar47._0_4_ >> 0x10);
  lVar42 = 0;
  piVar43 = &local_168;
  piVar44 = (int *)&local_150;
  bVar37 = true;
  do {
    bVar38 = bVar37;
    *piVar43 = (dequant_ptr[lVar42] * 0x145 + 0x40 >> 7) + *piVar44 * 0x20 + -1;
    lVar42 = 1;
    piVar43 = aiStack_164;
    piVar44 = (int *)((long)&local_150 + 4);
    bVar37 = false;
  } while (bVar38);
  auVar47 = *(undefined1 (*) [16])zbin_ptr;
  auVar79 = *(undefined1 (*) [16])round_ptr;
  auVar60 = *(undefined1 (*) [16])quant_ptr;
  auVar62 = *(undefined1 (*) [16])dequant_ptr;
  auVar67 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar48 = psraw(auVar47,0xf);
  auVar78 = psraw(auVar79,0xf);
  auVar153._0_12_ = auVar47._0_12_;
  auVar153._12_2_ = auVar47._6_2_;
  auVar153._14_2_ = auVar48._6_2_;
  auVar176._12_4_ = auVar153._12_4_;
  auVar176._0_10_ = auVar47._0_10_;
  auVar176._10_2_ = auVar48._4_2_;
  auVar144._10_6_ = auVar176._10_6_;
  auVar144._0_8_ = auVar47._0_8_;
  auVar144._8_2_ = auVar47._4_2_;
  auVar32._4_8_ = auVar144._8_8_;
  auVar32._2_2_ = auVar48._2_2_;
  auVar32._0_2_ = auVar47._2_2_;
  auVar165._0_12_ = auVar79._0_12_;
  auVar165._12_2_ = auVar79._6_2_;
  auVar165._14_2_ = auVar78._6_2_;
  auVar164._12_4_ = auVar165._12_4_;
  auVar164._0_10_ = auVar79._0_10_;
  auVar164._10_2_ = auVar78._4_2_;
  auVar163._10_6_ = auVar164._10_6_;
  auVar163._0_8_ = auVar79._0_8_;
  auVar163._8_2_ = auVar79._4_2_;
  auVar33._4_8_ = auVar163._8_8_;
  auVar33._2_2_ = auVar78._2_2_;
  auVar33._0_2_ = auVar79._2_2_;
  auVar171._8_4_ = 0xffffffff;
  auVar171._0_8_ = 0xffffffffffffffff;
  auVar171._12_4_ = 0xffffffff;
  uVar148 = auVar144._8_4_ + 1U >> 1;
  uVar150 = auVar176._12_4_ + 1U >> 1;
  iVar80 = uVar148 - 1;
  iVar81 = uVar150 - 1;
  uVar90 = *coeff_ptr >> 0x1f;
  uVar98 = coeff_ptr[1] >> 0x1f;
  uVar99 = coeff_ptr[2] >> 0x1f;
  uVar100 = coeff_ptr[3] >> 0x1f;
  uVar46 = coeff_ptr[4] >> 0x1f;
  uVar51 = coeff_ptr[5] >> 0x1f;
  uVar54 = coeff_ptr[6] >> 0x1f;
  uVar57 = coeff_ptr[7] >> 0x1f;
  iVar156 = (*coeff_ptr ^ uVar90) - uVar90;
  iVar159 = (coeff_ptr[1] ^ uVar98) - uVar98;
  iVar160 = (coeff_ptr[2] ^ uVar99) - uVar99;
  iVar161 = (coeff_ptr[3] ^ uVar100) - uVar100;
  iVar101 = (coeff_ptr[4] ^ uVar46) - uVar46;
  iVar107 = (coeff_ptr[5] ^ uVar51) - uVar51;
  iVar108 = (coeff_ptr[6] ^ uVar54) - uVar54;
  iVar109 = (coeff_ptr[7] ^ uVar57) - uVar57;
  auVar110._0_4_ = -(uint)(local_168 < iVar156 * 0x20);
  auVar110._4_4_ = -(uint)(aiStack_164[0] < iVar159 * 0x20);
  auVar110._8_4_ = -(uint)(aiStack_164[0] < iVar160 * 0x20);
  auVar110._12_4_ = -(uint)(aiStack_164[0] < iVar161 * 0x20);
  auVar152._0_4_ = -(uint)(aiStack_164[0] < iVar101 * 0x20);
  auVar152._4_4_ = -(uint)(aiStack_164[0] < iVar107 * 0x20);
  auVar152._8_4_ = -(uint)(aiStack_164[0] < iVar108 * 0x20);
  auVar152._12_4_ = -(uint)(aiStack_164[0] < iVar109 * 0x20);
  auVar110 = packssdw(auVar110,auVar152);
  local_178 = (undefined1  [16])0x0;
  bVar23 = (auVar110 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar24 = (auVar110 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar22 = (auVar110 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar21 = (auVar110 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar20 = (auVar110 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar19 = (auVar110 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar18 = (auVar110 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar17 = (auVar110 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar16 = (auVar110 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar15 = (auVar110 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar14 = (auVar110 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar13 = (auVar110 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar12 = (auVar110 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar11 = (auVar110 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar38 = (auVar110 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar37 = auVar110[0xf] < '\0';
  if (((((((((((((((bVar23 || bVar24) || bVar22) || bVar21) || bVar20) || bVar19) || bVar18) ||
             bVar17) || bVar16) || bVar15) || bVar14) || bVar13) || bVar12) || bVar11) || bVar38) ||
      bVar37) {
    local_178 = auVar110 & *(undefined1 (*) [16])iscan;
  }
  bVar37 = ((((((((((((((bVar23 || bVar24) || bVar22) || bVar21) || bVar20) || bVar19) || bVar18) ||
                  bVar17) || bVar16) || bVar15) || bVar14) || bVar13) || bVar12) || bVar11) ||
           bVar38) || bVar37;
  auVar153 = psraw(auVar60,0xf);
  auVar176 = psraw(auVar62,0xf);
  auVar110 = psraw(auVar67,0xf);
  auVar48._0_4_ = -(uint)(iVar156 < (int)(CONCAT22(auVar48._0_2_,auVar47._0_2_) + 1U >> 1));
  auVar48._4_4_ = -(uint)(iVar159 < (int)(auVar32._0_4_ + 1U >> 1));
  auVar48._8_4_ = -(uint)(iVar160 < (int)uVar148);
  auVar48._12_4_ = -(uint)(iVar161 < (int)uVar150);
  auVar154._0_4_ = -(uint)(iVar80 < iVar101);
  auVar154._4_4_ = -(uint)(iVar81 < iVar107);
  auVar154._8_4_ = -(uint)(iVar80 < iVar108);
  auVar154._12_4_ = -(uint)(iVar81 < iVar109);
  auVar47 = packssdw(auVar171 ^ auVar48,auVar154);
  uVar49 = (ushort)(SUB161(auVar47 >> 7,0) & 1) | (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
           (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
           (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
           (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
           (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
           (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
           (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
           (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
           (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
           (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
           (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
           (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
           (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
           (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar47[0xf] >> 7) << 0xf
  ;
  if (uVar49 == 0) {
    auVar47 = (undefined1  [16])0x0;
  }
  else {
    auVar47 = auVar47 & *(undefined1 (*) [16])iscan;
  }
  bVar38 = uVar49 != 0;
  auVar126._0_12_ = auVar60._0_12_;
  auVar126._12_2_ = auVar60._6_2_;
  auVar126._14_2_ = auVar153._6_2_;
  auVar125._12_4_ = auVar126._12_4_;
  auVar125._0_10_ = auVar60._0_10_;
  auVar125._10_2_ = auVar153._4_2_;
  auVar124._10_6_ = auVar125._10_6_;
  auVar124._0_8_ = auVar60._0_8_;
  auVar124._8_2_ = auVar60._4_2_;
  auVar34._4_8_ = auVar124._8_8_;
  auVar34._2_2_ = auVar153._2_2_;
  auVar34._0_2_ = auVar60._2_2_;
  auVar60._2_2_ = auVar153._0_2_;
  auVar60._4_12_ = auVar34;
  auVar84._0_12_ = auVar62._0_12_;
  auVar84._12_2_ = auVar62._6_2_;
  auVar84._14_2_ = auVar176._6_2_;
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._0_10_ = auVar62._0_10_;
  auVar83._10_2_ = auVar176._4_2_;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._0_8_ = auVar62._0_8_;
  auVar82._8_2_ = auVar62._4_2_;
  auVar35._4_8_ = auVar82._8_8_;
  auVar35._2_2_ = auVar176._2_2_;
  auVar35._0_2_ = auVar62._2_2_;
  auVar116._0_2_ = auVar62._0_2_;
  auVar116._2_2_ = auVar176._0_2_;
  auVar116._4_12_ = auVar35;
  auVar135._0_12_ = auVar67._0_12_;
  auVar135._12_2_ = auVar67._6_2_;
  auVar135._14_2_ = auVar110._6_2_;
  auVar134._12_4_ = auVar135._12_4_;
  auVar134._0_10_ = auVar67._0_10_;
  auVar134._10_2_ = auVar110._4_2_;
  auVar133._10_6_ = auVar134._10_6_;
  auVar133._0_8_ = auVar67._0_8_;
  auVar133._8_2_ = auVar67._4_2_;
  auVar36._4_8_ = auVar133._8_8_;
  auVar36._2_2_ = auVar110._2_2_;
  auVar36._0_2_ = auVar67._2_2_;
  auVar173._0_2_ = auVar67._0_2_;
  auVar173._2_2_ = auVar110._0_2_;
  auVar173._4_12_ = auVar36;
  uVar168 = auVar163._8_4_ + 1U >> 1;
  uVar169 = auVar164._12_4_ + 1U >> 1;
  iVar39 = movmskps((uint)uVar49,auVar171 ^ auVar48 | auVar154);
  uVar148 = auVar124._8_4_;
  uVar150 = auVar133._8_4_;
  uVar140 = auVar82._8_4_;
  auVar111._8_4_ = (int)uVar148 >> 0x1f;
  auVar111._12_4_ = (int)auVar125._12_4_ >> 0x1f;
  auVar62._8_4_ = (int)uVar150 >> 0x1f;
  auVar62._12_4_ = (int)auVar134._12_4_ >> 0x1f;
  auVar67._8_4_ = (int)uVar140 >> 0x1f;
  auVar67._12_4_ = (int)auVar83._12_4_ >> 0x1f;
  if (iVar39 == 0) {
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = (undefined1  [16])0x0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
    iVar101 = 0;
    iVar107 = 0;
    iVar108 = 0;
    iVar109 = 0;
  }
  else {
    auVar157._0_4_ = iVar156 + (CONCAT22(auVar78._0_2_,auVar79._0_2_) + 1U >> 1);
    auVar157._4_4_ = iVar159 + (auVar33._0_4_ + 1U >> 1);
    auVar157._8_4_ = iVar160 + uVar168;
    auVar157._12_4_ = iVar161 + uVar169;
    auVar111._0_4_ = (int)auVar153._0_2_ >> 0xf;
    auVar111._4_4_ = auVar34._0_4_ >> 0x1f;
    auVar172._0_8_ = CONCAT44(auVar111._0_4_,auVar111._0_4_);
    auVar172._8_4_ = auVar111._4_4_;
    auVar172._12_4_ = auVar111._4_4_;
    auVar177._0_8_ = CONCAT44(auVar111._8_4_,auVar111._8_4_);
    auVar177._8_4_ = auVar111._12_4_;
    auVar177._12_4_ = auVar111._12_4_;
    auVar60 = auVar60 ^ auVar111;
    auVar78._0_4_ = auVar60._0_4_ - auVar111._0_4_;
    auVar78._4_4_ = auVar60._4_4_ - auVar111._4_4_;
    auVar78._8_4_ = auVar60._8_4_ - auVar111._8_4_;
    auVar78._12_4_ = auVar60._12_4_ - auVar111._12_4_;
    auVar112._0_8_ = (ulong)auVar157._0_4_ * (ulong)auVar78._0_4_;
    auVar112._8_8_ = (auVar157._8_8_ & 0xffffffff) * (ulong)auVar78._8_4_;
    auVar61._0_8_ = (ulong)auVar78._4_4_ * (ulong)auVar157._4_4_;
    auVar61._8_8_ = (auVar78._8_8_ >> 0x20) * (auVar157._8_8_ >> 0x20);
    auVar85._0_4_ =
         (int)((ulong)(SUB168(auVar112 ^ auVar172,0) - auVar172._0_8_) >> 0x10) + auVar157._0_4_;
    auVar85._4_4_ =
         (int)((ulong)(SUB168(auVar61 ^ auVar177,0) - auVar177._0_8_) >> 0x10) + auVar157._4_4_;
    auVar85._8_4_ =
         (int)((ulong)(SUB168(auVar112 ^ auVar172,8) - auVar172._8_8_) >> 0x10) + auVar157._8_4_;
    auVar85._12_4_ =
         (int)((ulong)(SUB168(auVar61 ^ auVar177,8) - auVar177._8_8_) >> 0x10) + auVar157._12_4_;
    auVar62._0_4_ = (int)auVar110._0_2_ >> 0xf;
    auVar62._4_4_ = auVar36._0_4_ >> 0x1f;
    auVar113._0_8_ = CONCAT44(auVar62._0_4_,auVar62._0_4_);
    auVar113._8_4_ = auVar62._4_4_;
    auVar113._12_4_ = auVar62._4_4_;
    auVar158._0_8_ = CONCAT44(auVar62._8_4_,auVar62._8_4_);
    auVar158._8_4_ = auVar62._12_4_;
    auVar158._12_4_ = auVar62._12_4_;
    auVar173 = auVar173 ^ auVar62;
    auVar174._0_4_ = auVar173._0_4_ - auVar62._0_4_;
    auVar174._4_4_ = auVar173._4_4_ - auVar62._4_4_;
    auVar174._8_4_ = auVar173._8_4_ - auVar62._8_4_;
    auVar174._12_4_ = auVar173._12_4_ - auVar62._12_4_;
    auVar63._0_8_ = (ulong)auVar85._0_4_ * (ulong)auVar174._0_4_;
    auVar63._8_8_ = (auVar85._8_8_ & 0xffffffff) * (ulong)auVar174._8_4_;
    auVar175._0_8_ = (ulong)auVar174._4_4_ * (ulong)auVar85._4_4_;
    auVar175._8_8_ = (auVar174._8_8_ >> 0x20) * (auVar85._8_8_ >> 0x20);
    auVar102._0_4_ = iVar101 + uVar168;
    auVar102._4_4_ = iVar107 + uVar169;
    auVar102._8_4_ = iVar108 + uVar168;
    auVar102._12_4_ = iVar109 + uVar169;
    auVar114._0_8_ = CONCAT44(auVar111._8_4_,auVar111._8_4_);
    auVar114._8_4_ = auVar111._12_4_;
    auVar114._12_4_ = auVar111._12_4_;
    auVar127._0_8_ = CONCAT44(auVar111._8_4_,auVar111._8_4_);
    auVar127._8_4_ = auVar111._12_4_;
    auVar127._12_4_ = auVar111._12_4_;
    auVar136._0_4_ = (uVar148 ^ auVar111._8_4_) - auVar111._8_4_;
    auVar136._4_4_ = (auVar125._12_4_ ^ auVar111._12_4_) - auVar111._12_4_;
    auVar136._8_4_ = (uVar148 ^ auVar111._8_4_) - auVar111._8_4_;
    auVar136._12_4_ = (auVar125._12_4_ ^ auVar111._12_4_) - auVar111._12_4_;
    auVar64._0_8_ = (ulong)auVar102._0_4_ * (ulong)auVar136._0_4_;
    auVar64._8_8_ = (auVar102._8_8_ & 0xffffffff) * (ulong)auVar136._8_4_;
    auVar137._0_8_ = (ulong)auVar136._4_4_ * (ulong)auVar102._4_4_;
    auVar137._8_8_ = (auVar136._8_8_ >> 0x20) * (auVar102._8_8_ >> 0x20);
    auVar65._0_4_ =
         (int)((ulong)(SUB168(auVar64 ^ auVar114,0) - auVar114._0_8_) >> 0x10) + auVar102._0_4_;
    auVar65._4_4_ =
         (int)((ulong)(SUB168(auVar137 ^ auVar127,0) - auVar127._0_8_) >> 0x10) + auVar102._4_4_;
    auVar65._8_4_ =
         (int)((ulong)(SUB168(auVar64 ^ auVar114,8) - auVar114._8_8_) >> 0x10) + auVar102._8_4_;
    auVar65._12_4_ =
         (int)((ulong)(SUB168(auVar137 ^ auVar127,8) - auVar127._8_8_) >> 0x10) + auVar102._12_4_;
    auVar115._0_8_ = CONCAT44(auVar62._8_4_,auVar62._8_4_);
    auVar115._8_4_ = auVar62._12_4_;
    auVar115._12_4_ = auVar62._12_4_;
    auVar128._0_8_ = CONCAT44(auVar62._8_4_,auVar62._8_4_);
    auVar128._8_4_ = auVar62._12_4_;
    auVar128._12_4_ = auVar62._12_4_;
    auVar138._0_4_ = (uVar150 ^ auVar62._8_4_) - auVar62._8_4_;
    auVar138._4_4_ = (auVar134._12_4_ ^ auVar62._12_4_) - auVar62._12_4_;
    auVar138._8_4_ = (uVar150 ^ auVar62._8_4_) - auVar62._8_4_;
    auVar138._12_4_ = (auVar134._12_4_ ^ auVar62._12_4_) - auVar62._12_4_;
    auVar103._0_8_ = (ulong)auVar65._0_4_ * (ulong)auVar138._0_4_;
    auVar103._8_8_ = (auVar65._8_8_ & 0xffffffff) * (ulong)auVar138._8_4_;
    auVar139._0_8_ = (ulong)auVar138._4_4_ * (ulong)auVar65._4_4_;
    auVar139._8_8_ = (auVar138._8_8_ >> 0x20) * (auVar65._8_8_ >> 0x20);
    auVar145._0_4_ =
         ((uint)((ulong)(SUB168(auVar63 ^ auVar113,0) - auVar113._0_8_) >> 0xf) ^ uVar90) - uVar90;
    auVar145._4_4_ =
         ((uint)((ulong)((SUB168(auVar175 ^ auVar158,0) - auVar158._0_8_) * 0x20000) >> 0x20) ^
         uVar98) - uVar98;
    auVar145._8_4_ =
         ((uint)((ulong)(SUB168(auVar63 ^ auVar113,8) - auVar113._8_8_) >> 0xf) ^ uVar99) - uVar99;
    auVar145._12_4_ =
         ((uint)((ulong)((SUB168(auVar175 ^ auVar158,8) - auVar158._8_8_) * 0x20000) >> 0x20) ^
         uVar100) - uVar100;
    auVar66._0_4_ =
         ((uint)((ulong)(SUB168(auVar103 ^ auVar115,0) - auVar115._0_8_) >> 0xf) ^ uVar46) - uVar46;
    auVar66._4_4_ =
         ((uint)((ulong)((SUB168(auVar139 ^ auVar128,0) - auVar128._0_8_) * 0x20000) >> 0x20) ^
         uVar51) - uVar51;
    auVar66._8_4_ =
         ((uint)((ulong)(SUB168(auVar103 ^ auVar115,8) - auVar115._8_8_) >> 0xf) ^ uVar54) - uVar54;
    auVar66._12_4_ =
         ((uint)((ulong)((SUB168(auVar139 ^ auVar128,8) - auVar128._8_8_) * 0x20000) >> 0x20) ^
         uVar57) - uVar57;
    auVar145 = ~auVar48 & auVar145;
    auVar154 = auVar154 & auVar66;
    *(undefined1 (*) [16])qcoeff_ptr = auVar145;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = auVar154;
    auVar86._0_4_ = auVar145._0_4_ >> 0x1f;
    auVar86._4_4_ = auVar145._4_4_ >> 0x1f;
    auVar86._8_4_ = auVar145._8_4_ >> 0x1f;
    auVar86._12_4_ = auVar145._12_4_ >> 0x1f;
    auVar145 = auVar145 ^ auVar86;
    auVar146._0_4_ = auVar145._0_4_ - auVar86._0_4_;
    auVar146._4_4_ = auVar145._4_4_ - auVar86._4_4_;
    auVar146._8_4_ = auVar145._8_4_ - auVar86._8_4_;
    auVar146._12_4_ = auVar145._12_4_ - auVar86._12_4_;
    auVar67._0_4_ = (int)auVar176._0_2_ >> 0xf;
    auVar67._4_4_ = auVar35._0_4_ >> 0x1f;
    auVar91._0_8_ = CONCAT44(auVar67._0_4_,auVar67._0_4_);
    auVar91._8_4_ = auVar67._4_4_;
    auVar91._12_4_ = auVar67._4_4_;
    auVar104._0_8_ = CONCAT44(auVar67._8_4_,auVar67._8_4_);
    auVar104._8_4_ = auVar67._12_4_;
    auVar104._12_4_ = auVar67._12_4_;
    auVar116 = auVar116 ^ auVar67;
    auVar117._0_4_ = auVar116._0_4_ - auVar67._0_4_;
    auVar117._4_4_ = auVar116._4_4_ - auVar67._4_4_;
    auVar117._8_4_ = auVar116._8_4_ - auVar67._8_4_;
    auVar117._12_4_ = auVar116._12_4_ - auVar67._12_4_;
    auVar68._0_8_ = (ulong)auVar146._0_4_ * (ulong)auVar117._0_4_;
    auVar68._8_8_ = (auVar146._8_8_ & 0xffffffff) * (ulong)auVar117._8_4_;
    auVar118._0_8_ = (ulong)auVar117._4_4_ * (ulong)auVar146._4_4_;
    auVar118._8_8_ = (auVar117._8_8_ >> 0x20) * (auVar146._8_8_ >> 0x20);
    auVar70._0_4_ = (undefined4)((ulong)(SUB168(auVar68 ^ auVar91,0) - auVar91._0_8_) >> 1);
    auVar69._8_4_ = (undefined4)((ulong)(SUB168(auVar68 ^ auVar91,8) - auVar91._8_8_) >> 1);
    auVar69._4_4_ = auVar69._8_4_;
    auVar69._0_4_ = auVar70._0_4_;
    auVar69._12_4_ =
         (int)((ulong)((SUB168(auVar118 ^ auVar104,8) - auVar104._8_8_) * 0x80000000) >> 0x20);
    auVar70._8_8_ = auVar69._8_8_;
    auVar70._4_4_ =
         (int)((ulong)((SUB168(auVar118 ^ auVar104,0) - auVar104._0_8_) * 0x80000000) >> 0x20);
    auVar70 = auVar70 ^ auVar86;
    auVar87._0_4_ = auVar154._0_4_ >> 0x1f;
    auVar87._4_4_ = auVar154._4_4_ >> 0x1f;
    auVar87._8_4_ = auVar154._8_4_ >> 0x1f;
    auVar87._12_4_ = auVar154._12_4_ >> 0x1f;
    auVar154 = auVar154 ^ auVar87;
    auVar155._0_4_ = auVar154._0_4_ - auVar87._0_4_;
    auVar155._4_4_ = auVar154._4_4_ - auVar87._4_4_;
    auVar155._8_4_ = auVar154._8_4_ - auVar87._8_4_;
    auVar155._12_4_ = auVar154._12_4_ - auVar87._12_4_;
    auVar105._0_8_ = CONCAT44(auVar67._8_4_,auVar67._8_4_);
    auVar105._8_4_ = auVar67._12_4_;
    auVar105._12_4_ = auVar67._12_4_;
    auVar119._0_8_ = CONCAT44(auVar67._8_4_,auVar67._8_4_);
    auVar119._8_4_ = auVar67._12_4_;
    auVar119._12_4_ = auVar67._12_4_;
    auVar129._0_4_ = (uVar140 ^ auVar67._8_4_) - auVar67._8_4_;
    auVar129._4_4_ = (auVar83._12_4_ ^ auVar67._12_4_) - auVar67._12_4_;
    auVar129._8_4_ = (uVar140 ^ auVar67._8_4_) - auVar67._8_4_;
    auVar129._12_4_ = (auVar83._12_4_ ^ auVar67._12_4_) - auVar67._12_4_;
    auVar92._0_8_ = (ulong)auVar155._0_4_ * (ulong)auVar129._0_4_;
    auVar92._8_8_ = (auVar155._8_8_ & 0xffffffff) * (ulong)auVar129._8_4_;
    auVar130._0_8_ = (ulong)auVar129._4_4_ * (ulong)auVar155._4_4_;
    auVar130._8_8_ = (auVar129._8_8_ >> 0x20) * (auVar155._8_8_ >> 0x20);
    auVar94._0_4_ = (undefined4)((ulong)(SUB168(auVar92 ^ auVar105,0) - auVar105._0_8_) >> 1);
    auVar93._8_4_ = (undefined4)((ulong)(SUB168(auVar92 ^ auVar105,8) - auVar105._8_8_) >> 1);
    auVar93._4_4_ = auVar93._8_4_;
    auVar93._0_4_ = auVar94._0_4_;
    auVar93._12_4_ =
         (int)((ulong)((SUB168(auVar130 ^ auVar119,8) - auVar119._8_8_) * 0x80000000) >> 0x20);
    auVar94._8_8_ = auVar93._8_8_;
    auVar94._4_4_ =
         (int)((ulong)((SUB168(auVar130 ^ auVar119,0) - auVar119._0_8_) * 0x80000000) >> 0x20);
    auVar94 = auVar94 ^ auVar87;
    iVar101 = auVar94._0_4_ - auVar87._0_4_;
    iVar107 = auVar94._4_4_ - auVar87._4_4_;
    iVar108 = auVar94._8_4_ - auVar87._8_4_;
    iVar109 = auVar94._12_4_ - auVar87._12_4_;
    *dqcoeff_ptr = auVar70._0_4_ - auVar86._0_4_;
    dqcoeff_ptr[1] = auVar70._4_4_ - auVar86._4_4_;
    dqcoeff_ptr[2] = auVar70._8_4_ - auVar86._8_4_;
    dqcoeff_ptr[3] = auVar70._12_4_ - auVar86._12_4_;
  }
  local_178._2_2_ = (ushort)(-1 < (short)local_178._2_2_) * local_178._2_2_;
  local_178._0_2_ = (ushort)(-1 < (short)local_178._0_2_) * local_178._0_2_;
  local_178._4_2_ = (ushort)(-1 < (short)local_178._4_2_) * local_178._4_2_;
  local_178._6_2_ = (ushort)(-1 < (short)local_178._6_2_) * local_178._6_2_;
  local_178._8_2_ = (ushort)(-1 < (short)local_178._8_2_) * local_178._8_2_;
  local_178._10_2_ = (ushort)(-1 < (short)local_178._10_2_) * local_178._10_2_;
  local_178._12_2_ = (ushort)(-1 < (short)local_178._12_2_) * local_178._12_2_;
  local_178._14_2_ = (ushort)(-1 < (short)local_178._14_2_) * local_178._14_2_;
  uVar45 = (ushort)(-1 < auVar47._0_2_) * auVar47._0_2_;
  uVar49 = (ushort)(-1 < auVar47._2_2_) * auVar47._2_2_;
  uVar50 = (ushort)(-1 < auVar47._4_2_) * auVar47._4_2_;
  uVar52 = (ushort)(-1 < auVar47._6_2_) * auVar47._6_2_;
  uVar53 = (ushort)(-1 < auVar47._8_2_) * auVar47._8_2_;
  uVar55 = (ushort)(-1 < auVar47._10_2_) * auVar47._10_2_;
  uVar56 = (ushort)(-1 < auVar47._12_2_) * auVar47._12_2_;
  uVar58 = (ushort)(-1 < auVar47._14_2_) * auVar47._14_2_;
  dqcoeff_ptr[4] = iVar101;
  dqcoeff_ptr[5] = iVar107;
  dqcoeff_ptr[6] = iVar108;
  dqcoeff_ptr[7] = iVar109;
  if (8 < n_coeffs) {
    uVar162 = (uVar148 ^ auVar111._8_4_) - auVar111._8_4_;
    uVar167 = (auVar125._12_4_ ^ auVar111._12_4_) - auVar111._12_4_;
    uVar148 = (uVar148 ^ auVar111._8_4_) - auVar111._8_4_;
    uVar170 = (auVar125._12_4_ ^ auVar111._12_4_) - auVar111._12_4_;
    uVar90 = (uVar150 ^ auVar62._8_4_) - auVar62._8_4_;
    uVar98 = (auVar134._12_4_ ^ auVar62._12_4_) - auVar62._12_4_;
    uVar99 = (uVar150 ^ auVar62._8_4_) - auVar62._8_4_;
    uVar100 = (auVar134._12_4_ ^ auVar62._12_4_) - auVar62._12_4_;
    uVar46 = (uVar140 ^ auVar67._8_4_) - auVar67._8_4_;
    uVar51 = (auVar83._12_4_ ^ auVar67._12_4_) - auVar67._12_4_;
    uVar54 = (uVar140 ^ auVar67._8_4_) - auVar67._8_4_;
    uVar57 = (auVar83._12_4_ ^ auVar67._12_4_) - auVar67._12_4_;
    lVar42 = 8;
    uVar40 = CONCAT44(auVar111._8_4_,auVar111._8_4_);
    uVar31 = CONCAT44(auVar111._12_4_,auVar111._12_4_);
    do {
      puVar1 = (uint *)(coeff_ptr + lVar42);
      puVar2 = (uint *)(coeff_ptr + lVar42 + 4);
      uVar143 = (int)*puVar1 >> 0x1f;
      uVar147 = (int)puVar1[1] >> 0x1f;
      uVar149 = (int)puVar1[2] >> 0x1f;
      uVar151 = (int)puVar1[3] >> 0x1f;
      uVar150 = (int)*puVar2 >> 0x1f;
      uVar140 = (int)puVar2[1] >> 0x1f;
      uVar141 = (int)puVar2[2] >> 0x1f;
      uVar142 = (int)puVar2[3] >> 0x1f;
      iVar101 = (*puVar1 ^ uVar143) - uVar143;
      iVar107 = (puVar1[1] ^ uVar147) - uVar147;
      iVar108 = (puVar1[2] ^ uVar149) - uVar149;
      iVar109 = (puVar1[3] ^ uVar151) - uVar151;
      iVar156 = (*puVar2 ^ uVar150) - uVar150;
      iVar159 = (puVar2[1] ^ uVar140) - uVar140;
      iVar160 = (puVar2[2] ^ uVar141) - uVar141;
      iVar161 = (puVar2[3] ^ uVar142) - uVar142;
      auVar47._0_4_ = -(uint)(aiStack_164[0] < iVar101 * 0x20);
      auVar47._4_4_ = -(uint)(aiStack_164[0] < iVar107 * 0x20);
      auVar47._8_4_ = -(uint)(aiStack_164[0] < iVar108 * 0x20);
      auVar47._12_4_ = -(uint)(aiStack_164[0] < iVar109 * 0x20);
      auVar106._0_4_ = -(uint)(aiStack_164[0] < iVar156 * 0x20);
      auVar106._4_4_ = -(uint)(aiStack_164[0] < iVar159 * 0x20);
      auVar106._8_4_ = -(uint)(aiStack_164[0] < iVar160 * 0x20);
      auVar106._12_4_ = -(uint)(aiStack_164[0] < iVar161 * 0x20);
      auVar47 = packssdw(auVar47,auVar106);
      auVar79 = (undefined1  [16])0x0;
      if ((((((((((((((((auVar47 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar47 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar47 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar47 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar47 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar47 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar47 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar47 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar47 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar47 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar47 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar47 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar47[0xf] < '\0'
         ) {
        auVar79 = auVar47 & *(undefined1 (*) [16])(iscan + lVar42);
        bVar37 = true;
      }
      auVar120._0_4_ = -(uint)(iVar80 < iVar101);
      auVar120._4_4_ = -(uint)(iVar81 < iVar107);
      auVar120._8_4_ = -(uint)(iVar80 < iVar108);
      auVar120._12_4_ = -(uint)(iVar81 < iVar109);
      auVar88._0_4_ = -(uint)(iVar80 < iVar156);
      auVar88._4_4_ = -(uint)(iVar81 < iVar159);
      auVar88._8_4_ = -(uint)(iVar80 < iVar160);
      auVar88._12_4_ = -(uint)(iVar81 < iVar161);
      auVar47 = packssdw(auVar120,auVar88);
      uVar59 = (ushort)(SUB161(auVar47 >> 7,0) & 1) | (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar47[0xf] >> 7) << 0xf;
      if (uVar59 == 0) {
        auVar47 = (undefined1  [16])0x0;
      }
      else {
        auVar47 = auVar47 & *(undefined1 (*) [16])(iscan + lVar42);
        bVar38 = true;
      }
      iVar39 = movmskps((uint)uVar59,auVar88 | auVar120);
      if (iVar39 == 0) {
        *(undefined1 (*) [16])(qcoeff_ptr + lVar42 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar42) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar42 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar42) = (undefined1  [16])0x0;
      }
      else {
        auVar131._0_4_ = iVar101 + uVar168;
        auVar131._4_4_ = iVar107 + uVar169;
        auVar131._8_4_ = iVar108 + uVar168;
        auVar131._12_4_ = iVar109 + uVar169;
        uVar29 = CONCAT44(auVar111._8_4_,auVar111._8_4_);
        uVar30 = CONCAT44(auVar111._12_4_,auVar111._12_4_);
        auVar71._0_4_ =
             (int)(((ulong)auVar131._0_4_ * (ulong)uVar162 ^ uVar40) - uVar40 >> 0x10) +
             auVar131._0_4_;
        auVar71._4_4_ =
             (int)(((ulong)auVar131._4_4_ * (ulong)uVar167 ^ uVar29) - uVar29 >> 0x10) +
             auVar131._4_4_;
        auVar71._8_4_ =
             (int)(((auVar131._8_8_ & 0xffffffff) * (ulong)uVar148 ^ uVar31) - uVar31 >> 0x10) +
             auVar131._8_4_;
        auVar71._12_4_ =
             (int)(((auVar131._8_8_ >> 0x20) * (ulong)uVar170 ^ uVar30) - uVar30 >> 0x10) +
             auVar131._12_4_;
        uVar27 = CONCAT44(auVar62._8_4_,auVar62._8_4_);
        uVar28 = CONCAT44(auVar62._12_4_,auVar62._12_4_);
        uVar25 = CONCAT44(auVar62._8_4_,auVar62._8_4_);
        uVar26 = CONCAT44(auVar62._12_4_,auVar62._12_4_);
        auVar166._0_4_ = iVar156 + uVar168;
        auVar166._4_4_ = iVar159 + uVar169;
        auVar166._8_4_ = iVar160 + uVar168;
        auVar166._12_4_ = iVar161 + uVar169;
        auVar72._0_4_ =
             (int)(((ulong)auVar166._0_4_ * (ulong)uVar162 ^ uVar40) - uVar40 >> 0x10) +
             auVar166._0_4_;
        auVar72._4_4_ =
             (int)(((ulong)auVar166._4_4_ * (ulong)uVar167 ^ uVar29) - uVar29 >> 0x10) +
             auVar166._4_4_;
        auVar72._8_4_ =
             (int)(((auVar166._8_8_ & 0xffffffff) * (ulong)uVar148 ^ uVar31) - uVar31 >> 0x10) +
             auVar166._8_4_;
        auVar72._12_4_ =
             (int)(((auVar166._8_8_ >> 0x20) * (ulong)uVar170 ^ uVar30) - uVar30 >> 0x10) +
             auVar166._12_4_;
        auVar95._0_4_ =
             ((uint)(((ulong)auVar71._0_4_ * (ulong)uVar90 ^ uVar27) - uVar27 >> 0xf) ^ uVar143) -
             uVar143;
        auVar95._4_4_ =
             ((uint)((((ulong)auVar71._4_4_ * (ulong)uVar98 ^ uVar25) - uVar25) * 0x20000 >> 0x20) ^
             uVar147) - uVar147;
        auVar95._8_4_ =
             ((uint)(((auVar71._8_8_ & 0xffffffff) * (ulong)uVar99 ^ uVar28) - uVar28 >> 0xf) ^
             uVar149) - uVar149;
        auVar95._12_4_ =
             ((uint)((((auVar71._8_8_ >> 0x20) * (ulong)uVar100 ^ uVar26) - uVar26) * 0x20000 >>
                    0x20) ^ uVar151) - uVar151;
        auVar132._0_4_ =
             ((uint)(((ulong)auVar72._0_4_ * (ulong)uVar90 ^ uVar27) - uVar27 >> 0xf) ^ uVar150) -
             uVar150;
        auVar132._4_4_ =
             ((uint)((((ulong)auVar72._4_4_ * (ulong)uVar98 ^ uVar25) - uVar25) * 0x20000 >> 0x20) ^
             uVar140) - uVar140;
        auVar132._8_4_ =
             ((uint)(((auVar72._8_8_ & 0xffffffff) * (ulong)uVar99 ^ uVar28) - uVar28 >> 0xf) ^
             uVar141) - uVar141;
        auVar132._12_4_ =
             ((uint)((((auVar72._8_8_ >> 0x20) * (ulong)uVar100 ^ uVar26) - uVar26) * 0x20000 >>
                    0x20) ^ uVar142) - uVar142;
        auVar120 = auVar120 & auVar95;
        auVar88 = auVar88 & auVar132;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar42) = auVar120;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar42 + 4) = auVar88;
        auVar96._0_4_ = auVar120._0_4_ >> 0x1f;
        auVar96._4_4_ = auVar120._4_4_ >> 0x1f;
        auVar96._8_4_ = auVar120._8_4_ >> 0x1f;
        auVar96._12_4_ = auVar120._12_4_ >> 0x1f;
        auVar120 = auVar120 ^ auVar96;
        auVar121._0_4_ = auVar120._0_4_ - auVar96._0_4_;
        auVar121._4_4_ = auVar120._4_4_ - auVar96._4_4_;
        auVar121._8_4_ = auVar120._8_4_ - auVar96._8_4_;
        auVar121._12_4_ = auVar120._12_4_ - auVar96._12_4_;
        uVar27 = CONCAT44(auVar67._8_4_,auVar67._8_4_);
        uVar28 = CONCAT44(auVar67._12_4_,auVar67._12_4_);
        uVar25 = CONCAT44(auVar67._8_4_,auVar67._8_4_);
        uVar26 = CONCAT44(auVar67._12_4_,auVar67._12_4_);
        auVar74._0_4_ = (undefined4)(((ulong)auVar121._0_4_ * (ulong)uVar46 ^ uVar27) - uVar27 >> 1)
        ;
        auVar73._8_4_ =
             (undefined4)(((auVar121._8_8_ & 0xffffffff) * (ulong)uVar54 ^ uVar28) - uVar28 >> 1);
        auVar73._4_4_ = auVar73._8_4_;
        auVar73._0_4_ = auVar74._0_4_;
        auVar73._12_4_ =
             (int)((((auVar121._8_8_ >> 0x20) * (ulong)uVar57 ^ uVar26) - uVar26) * 0x80000000 >>
                  0x20);
        auVar74._8_8_ = auVar73._8_8_;
        auVar74._4_4_ =
             (int)((((ulong)auVar121._4_4_ * (ulong)uVar51 ^ uVar25) - uVar25) * 0x80000000 >> 0x20)
        ;
        auVar74 = auVar74 ^ auVar96;
        auVar97._0_4_ = auVar88._0_4_ >> 0x1f;
        auVar97._4_4_ = auVar88._4_4_ >> 0x1f;
        auVar97._8_4_ = auVar88._8_4_ >> 0x1f;
        auVar97._12_4_ = auVar88._12_4_ >> 0x1f;
        auVar88 = auVar88 ^ auVar97;
        auVar89._0_4_ = auVar88._0_4_ - auVar97._0_4_;
        auVar89._4_4_ = auVar88._4_4_ - auVar97._4_4_;
        auVar89._8_4_ = auVar88._8_4_ - auVar97._8_4_;
        auVar89._12_4_ = auVar88._12_4_ - auVar97._12_4_;
        auVar123._0_4_ = (undefined4)(((ulong)auVar89._0_4_ * (ulong)uVar46 ^ uVar27) - uVar27 >> 1)
        ;
        auVar122._8_4_ =
             (undefined4)(((auVar89._8_8_ & 0xffffffff) * (ulong)uVar54 ^ uVar28) - uVar28 >> 1);
        auVar122._4_4_ = auVar122._8_4_;
        auVar122._0_4_ = auVar123._0_4_;
        auVar122._12_4_ =
             (int)((((auVar89._8_8_ >> 0x20) * (ulong)uVar57 ^ uVar26) - uVar26) * 0x80000000 >>
                  0x20);
        auVar123._8_8_ = auVar122._8_8_;
        auVar123._4_4_ =
             (int)((((ulong)auVar89._4_4_ * (ulong)uVar51 ^ uVar25) - uVar25) * 0x80000000 >> 0x20);
        auVar123 = auVar123 ^ auVar97;
        piVar43 = dqcoeff_ptr + lVar42;
        *piVar43 = auVar74._0_4_ - auVar96._0_4_;
        piVar43[1] = auVar74._4_4_ - auVar96._4_4_;
        piVar43[2] = auVar74._8_4_ - auVar96._8_4_;
        piVar43[3] = auVar74._12_4_ - auVar96._12_4_;
        piVar43 = dqcoeff_ptr + lVar42 + 4;
        *piVar43 = auVar123._0_4_ - auVar97._0_4_;
        piVar43[1] = auVar123._4_4_ - auVar97._4_4_;
        piVar43[2] = auVar123._8_4_ - auVar97._8_4_;
        piVar43[3] = auVar123._12_4_ - auVar97._12_4_;
      }
      sVar3 = auVar79._0_2_;
      sVar4 = auVar79._2_2_;
      sVar5 = auVar79._4_2_;
      sVar6 = auVar79._6_2_;
      sVar7 = auVar79._8_2_;
      sVar8 = auVar79._10_2_;
      sVar9 = auVar79._12_2_;
      sVar10 = auVar79._14_2_;
      local_178._2_2_ =
           (ushort)((short)local_178._2_2_ < sVar4) * sVar4 |
           (ushort)((short)local_178._2_2_ >= sVar4) * local_178._2_2_;
      local_178._0_2_ =
           (ushort)((short)local_178._0_2_ < sVar3) * sVar3 |
           (ushort)((short)local_178._0_2_ >= sVar3) * local_178._0_2_;
      local_178._4_2_ =
           (ushort)((short)local_178._4_2_ < sVar5) * sVar5 |
           (ushort)((short)local_178._4_2_ >= sVar5) * local_178._4_2_;
      local_178._6_2_ =
           (ushort)((short)local_178._6_2_ < sVar6) * sVar6 |
           (ushort)((short)local_178._6_2_ >= sVar6) * local_178._6_2_;
      local_178._8_2_ =
           (ushort)((short)local_178._8_2_ < sVar7) * sVar7 |
           (ushort)((short)local_178._8_2_ >= sVar7) * local_178._8_2_;
      local_178._10_2_ =
           (ushort)((short)local_178._10_2_ < sVar8) * sVar8 |
           (ushort)((short)local_178._10_2_ >= sVar8) * local_178._10_2_;
      local_178._12_2_ =
           (ushort)((short)local_178._12_2_ < sVar9) * sVar9 |
           (ushort)((short)local_178._12_2_ >= sVar9) * local_178._12_2_;
      local_178._14_2_ =
           (ushort)((short)local_178._14_2_ < sVar10) * sVar10 |
           (ushort)((short)local_178._14_2_ >= sVar10) * local_178._14_2_;
      sVar3 = auVar47._0_2_;
      uVar45 = (ushort)((short)uVar45 < sVar3) * sVar3 | ((short)uVar45 >= sVar3) * uVar45;
      sVar3 = auVar47._2_2_;
      uVar49 = (ushort)((short)uVar49 < sVar3) * sVar3 | ((short)uVar49 >= sVar3) * uVar49;
      sVar3 = auVar47._4_2_;
      uVar50 = (ushort)((short)uVar50 < sVar3) * sVar3 | ((short)uVar50 >= sVar3) * uVar50;
      sVar3 = auVar47._6_2_;
      uVar52 = (ushort)((short)uVar52 < sVar3) * sVar3 | ((short)uVar52 >= sVar3) * uVar52;
      sVar3 = auVar47._8_2_;
      uVar53 = (ushort)((short)uVar53 < sVar3) * sVar3 | ((short)uVar53 >= sVar3) * uVar53;
      sVar3 = auVar47._10_2_;
      uVar55 = (ushort)((short)uVar55 < sVar3) * sVar3 | ((short)uVar55 >= sVar3) * uVar55;
      sVar3 = auVar47._12_2_;
      uVar56 = (ushort)((short)uVar56 < sVar3) * sVar3 | ((short)uVar56 >= sVar3) * uVar56;
      sVar3 = auVar47._14_2_;
      uVar58 = (ushort)((short)uVar58 < sVar3) * sVar3 | ((short)uVar58 >= sVar3) * uVar58;
      lVar42 = lVar42 + 8;
    } while (lVar42 < n_coeffs);
  }
  if (bVar37) {
    uVar59 = (ushort)((short)local_178._8_2_ < (short)local_178._0_2_) * local_178._0_2_ |
             (ushort)((short)local_178._8_2_ >= (short)local_178._0_2_) * local_178._8_2_;
    uVar75 = (ushort)((short)local_178._10_2_ < (short)local_178._2_2_) * local_178._2_2_ |
             (ushort)((short)local_178._10_2_ >= (short)local_178._2_2_) * local_178._10_2_;
    uVar76 = (ushort)((short)local_178._12_2_ < (short)local_178._4_2_) * local_178._4_2_ |
             (ushort)((short)local_178._12_2_ >= (short)local_178._4_2_) * local_178._12_2_;
    uVar77 = (ushort)((short)local_178._14_2_ < (short)local_178._6_2_) * local_178._6_2_ |
             (ushort)((short)local_178._14_2_ >= (short)local_178._6_2_) * local_178._14_2_;
    uVar59 = ((short)uVar76 < (short)uVar59) * uVar59 | ((short)uVar76 >= (short)uVar59) * uVar76;
    uVar75 = ((short)uVar77 < (short)uVar75) * uVar75 | ((short)uVar77 >= (short)uVar75) * uVar77;
    uVar46 = (ushort)(((short)uVar75 < (short)uVar59) * uVar59 |
                     ((short)uVar75 >= (short)uVar59) * uVar75) + 1;
  }
  else {
    uVar46 = 0;
  }
  if (bVar38) {
    uVar53 = ((short)uVar53 < (short)uVar45) * uVar45 | ((short)uVar53 >= (short)uVar45) * uVar53;
    uVar55 = ((short)uVar55 < (short)uVar49) * uVar49 | ((short)uVar55 >= (short)uVar49) * uVar55;
    uVar49 = ((short)uVar56 < (short)uVar50) * uVar50 | ((short)uVar56 >= (short)uVar50) * uVar56;
    uVar50 = ((short)uVar58 < (short)uVar52) * uVar52 | ((short)uVar58 >= (short)uVar52) * uVar58;
    uVar49 = ((short)uVar49 < (short)uVar53) * uVar53 | ((short)uVar49 >= (short)uVar53) * uVar49;
    uVar50 = ((short)uVar50 < (short)uVar55) * uVar55 | ((short)uVar50 >= (short)uVar55) * uVar50;
    uVar51 = (uint)(ushort)(((short)uVar50 < (short)uVar49) * uVar49 |
                           ((short)uVar50 >= (short)uVar49) * uVar50);
  }
  else {
    uVar51 = 0xffffffff;
  }
  if ((int)uVar46 <= (int)uVar51) {
    iVar80 = uVar51 + 1;
    psVar41 = scan + uVar51;
    do {
      sVar3 = *psVar41;
      qcoeff_ptr[sVar3] = 0;
      dqcoeff_ptr[sVar3] = 0;
      iVar80 = iVar80 + -1;
      psVar41 = psVar41 + -1;
    } while ((int)uVar46 < iVar80);
  }
  iVar80 = uVar46 + 1;
  uVar40 = (ulong)uVar46;
  do {
    if ((long)uVar40 < 1) {
      uVar49 = 0;
      break;
    }
    lVar42 = uVar40 - 1;
    uVar40 = uVar40 - 1;
    iVar80 = iVar80 + -1;
    uVar49 = (ushort)iVar80;
  } while (qcoeff_ptr[scan[lVar42]] == 0);
  *eob_ptr = uVar49;
  uVar51 = 0xffffffff;
  if (uVar46 != 0) {
    uVar40 = 0;
    do {
      if (qcoeff_ptr[scan[uVar40]] != 0) {
        uVar51 = (uint)uVar40;
        break;
      }
      uVar40 = uVar40 + 1;
    } while (uVar46 != uVar40);
  }
  if ((uVar49 != 0) && (uVar51 == uVar49 - 1)) {
    sVar3 = scan[uVar51];
    if (((qcoeff_ptr[sVar3] == 1) || (qcoeff_ptr[sVar3] == -1)) &&
       (uVar46 = coeff_ptr[sVar3] >> 0x1f,
       (int)((coeff_ptr[sVar3] << 5 ^ uVar46) - uVar46) <
       *(int *)((long)&local_150 + (ulong)(sVar3 != 0) * 4) * 0x20 +
       (dequant_ptr[sVar3 != 0] * 0x20d + 0x40 >> 7))) {
      qcoeff_ptr[sVar3] = 0;
      dqcoeff_ptr[sVar3] = 0;
      *eob_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_highbd_quantize_b_32x32_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 8;
  const int log_scale = 1;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi32(1);
  const __m128i log_scale_vec = _mm_set1_epi32(log_scale);
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1, cmp_mask;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbins[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  round = _mm_load_si128((const __m128i *)round_ptr);
  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  __m128i zbin_sign = _mm_srai_epi16(zbin, 15);
  __m128i round_sign = _mm_srai_epi16(round, 15);
  __m128i quant_sign = _mm_srai_epi16(quant, 15);
  __m128i dequant_sign = _mm_srai_epi16(dequant, 15);
  __m128i shift_sign = _mm_srai_epi16(shift, 15);

  zbin = _mm_unpacklo_epi16(zbin, zbin_sign);
  round = _mm_unpacklo_epi16(round, round_sign);
  quant = _mm_unpacklo_epi16(quant, quant_sign);
  dequant = _mm_unpacklo_epi16(dequant, dequant_sign);
  shift = _mm_unpacklo_epi16(shift, shift_sign);

  // Shift with rounding.
  zbin = _mm_add_epi32(zbin, log_scale_vec);
  round = _mm_add_epi32(round, log_scale_vec);
  zbin = _mm_srli_epi32(zbin, log_scale);
  round = _mm_srli_epi32(round, log_scale);
  zbin = _mm_sub_epi32(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = _mm_load_si128((__m128i *)(coeff_ptr));
  coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + 4));

  coeff0_sign = _mm_srai_epi32(coeff0, 31);
  coeff1_sign = _mm_srai_epi32(coeff1, 31);
  qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

  highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
  cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
  highbd_update_mask1(&cmp_mask, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    // Reinsert signs
    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), coeff1);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = _mm_load_si128((__m128i *)(coeff_ptr + index));
    coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + index + 4));

    coeff0_sign = _mm_srai_epi32(coeff0, 31);
    coeff1_sign = _mm_srai_epi32(coeff1, 31);
    qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

    highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index,
                        &is_found0, &mask0);

    cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
    cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
    highbd_update_mask1(&cmp_mask, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      index += 8;
      continue;
    }
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr + index), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);

    _mm_store_si128((__m128i *)(dqcoeff_ptr + index), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), coeff1);

    index += 8;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}